

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O3

obj * gold_at(level *lev,int x,int y)

{
  obj *poVar1;
  
  poVar1 = lev->objects[x][y];
  while( true ) {
    if (poVar1 == (obj *)0x0) {
      return (obj *)0x0;
    }
    if (poVar1->oclass == '\f') break;
    poVar1 = (poVar1->v).v_nexthere;
  }
  return poVar1;
}

Assistant:

struct obj *gold_at(struct level *lev, int x, int y)
{
	struct obj *obj = lev->objects[x][y];
	while (obj) {
	    if (obj->oclass == COIN_CLASS) return obj;
	    obj = obj->nexthere;
	}
	return NULL;
}